

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_tlbiva(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *tcg_ctx;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGv_i64 arg;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  TCGTemp *local_38;
  long local_30;
  
  if (ctx->pr == true) {
    gen_exception_err(ctx,6,0x31);
    return;
  }
  s = ctx->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)s);
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar1 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)((long)tcg_ctx + (long)ret),
                          (TCGArg)(arg + (long)tcg_ctx));
      }
      goto LAB_00b9c572;
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx + (long)ret),
                      (TCGArg)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[uVar1]),
                      (TCGArg)(arg + (long)tcg_ctx));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00b9c572;
  }
  tcg_gen_ext32u_i64_ppc64(tcg_ctx,ret,arg);
LAB_00b9c572:
  local_38 = (TCGTemp *)(s->cpu_env + (long)s);
  local_30 = (long)&s->pool_cur + *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  tcg_gen_callN_ppc64(s,helper_tlbiva_ppc64,(TCGTemp *)0x0,2,&local_38);
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_tlbiva(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    CHK_SV;
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    gen_helper_tlbiva(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rB(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, t0);
}